

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O2

uchar __thiscall chatra::Reader::readRawInteger<unsigned_char>(Reader *this)

{
  size_type sVar1;
  byte bVar2;
  byte *pbVar3;
  undefined8 *puVar4;
  ulong uVar5;
  uint position;
  ulong uVar6;
  
  checkSpace(this,1);
  sVar1 = this->offset;
  this->offset = sVar1 + 1;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this->buffer,sVar1);
  bVar2 = *pbVar3;
  if ((char)bVar2 < '\0') {
    uVar5 = (ulong)(bVar2 & 0x7f);
    uVar6 = 7;
    while( true ) {
      if (0x3f < uVar6) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
        puVar4[2] = 0;
        puVar4[3] = 0;
        puVar4[4] = 0;
        puVar4[1] = puVar4 + 3;
        *(undefined1 *)(puVar4 + 3) = 0;
        *puVar4 = &PTR__NativeException_0023ce78;
        __cxa_throw(puVar4,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
      }
      checkSpace(this,1);
      sVar1 = this->offset;
      this->offset = sVar1 + 1;
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this->buffer,sVar1);
      bVar2 = *pbVar3;
      if (-1 < (char)bVar2) break;
      uVar5 = uVar5 | (ulong)(bVar2 & 0x7f) << ((byte)uVar6 & 0x3f);
      uVar6 = uVar6 + 7;
    }
    bVar2 = (bVar2 < 0x40) - 1U ^ ((byte)uVar5 | (byte)((bVar2 & 0x3f) << ((byte)uVar6 & 0x3f)));
  }
  return bVar2;
}

Assistant:

Type readRawInteger() {
		checkSpace();
		auto t = static_cast<uint64_t>(buffer->at(offset++));
		if (t < 128)
			return static_cast<Type>(t);
		t &= 0x7FU;
		for (unsigned position = 7; position < 64; position += 7) {
			checkSpace();
			auto c = static_cast<uint64_t>(buffer->at(offset++));
			if (c & 0x80U)
				t |= (c & 0x7FU) << position;
			else {
				t |= (c & 0x3FU) << position;
				return static_cast<Type>(c & 0x40U ? ~t : t);
			}
		}
		throw IllegalArgumentException();
	}